

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O1

string * __thiscall
tinyusdz::value::print_strided_array_snipped<std::array<unsigned_char,3ul>>
          (string *__return_storage_ptr__,value *this,uint8_t *vals,size_t stride_bytes,size_t n,
          size_t N)

{
  ulong uVar1;
  size_t i;
  ulong uVar2;
  size_t sVar3;
  value *pvVar4;
  stringstream os;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  sVar3 = n;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if ((vals == (uint8_t *)0x3) || (vals == (uint8_t *)0x0)) {
    print_array_snipped<std::array<unsigned_char,3ul>>
              (__return_storage_ptr__,this,(array<unsigned_char,_3UL> *)stride_bytes,n,sVar3);
  }
  else {
    if (n == 0 || stride_bytes <= n * 2) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      if (stride_bytes != 0) {
        sVar3 = 0;
        do {
          if (sVar3 != 0) {
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
          }
          ::std::operator<<(local_1a8,(uchar3 *)this);
          sVar3 = sVar3 + 1;
          this = this + (long)vals;
        } while (stride_bytes != sVar3);
      }
    }
    else {
      uVar1 = stride_bytes - n;
      if (stride_bytes < n) {
        n = stride_bytes;
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      uVar2 = 0;
      pvVar4 = this;
      do {
        if (uVar2 != 0) {
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
        }
        ::std::operator<<(local_1a8,(uchar3 *)pvVar4);
        uVar2 = uVar2 + 1;
        pvVar4 = pvVar4 + (long)vals;
      } while (n != uVar2);
      if (n < uVar1) {
        n = uVar1;
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ..., ",7);
      if (n < stride_bytes) {
        pvVar4 = this + (long)vals * n;
        uVar1 = n;
        do {
          if (n < uVar1) {
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
          }
          ::std::operator<<(local_1a8,(uchar3 *)pvVar4);
          uVar1 = uVar1 + 1;
          pvVar4 = pvVar4 + (long)vals;
        } while (stride_bytes != uVar1);
      }
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
    ::std::__cxx11::stringbuf::str();
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_strided_array_snipped(const uint8_t *vals, size_t stride_bytes, const size_t n, size_t N = 16) {
  std::stringstream os;

  if ((stride_bytes == 0) || (stride_bytes == sizeof(T))) { // tightly packed.
    return print_array_snipped(reinterpret_cast<const T*>(vals), n, N);
  }

  if ((N == 0) || ((N * 2) >= n)) {
    os << "[";
    for (size_t i = 0; i < n; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << *reinterpret_cast<const T *>(&vals[i * stride_bytes]);
    }
    os << "]";
  } else {
    size_t head_end = (std::min)(N, n);
    size_t tail_start = (std::max)(n - N, head_end);

    os << "[";

    for (size_t i = 0; i < head_end; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << *reinterpret_cast<const T *>(&vals[i * stride_bytes]);
    }

    os << ", ..., ";

    for (size_t i = tail_start; i < n; i++) {
      if (i > tail_start) {
        os << ", ";
      }
      os << *reinterpret_cast<const T *>(&vals[i * stride_bytes]);
    }

    os << "]";
  }
  return os.str();
}